

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# h265e_slice.c
# Opt level: O1

RK_U8 find_matching_ltrp(H265eSlice *slice,RK_U32 *ltrpsIndex,RK_S32 ltrpPOC,RK_U32 usedFlag)

{
  H265eSps *pHVar1;
  ulong uVar2;
  
  pHVar1 = slice->m_sps;
  if ((ulong)pHVar1->m_numLongTermRefPicSPS != 0) {
    uVar2 = 0;
    do {
      if ((ltrpPOC % (1 << ((byte)pHVar1->m_bitsForPOC & 0x1f)) ==
           pHVar1->m_ltRefPicPocLsbSps[uVar2]) &&
         (pHVar1->m_usedByCurrPicLtSPSFlag[uVar2] == usedFlag)) {
        *ltrpsIndex = (RK_U32)uVar2;
        return '\x01';
      }
      uVar2 = uVar2 + 1;
    } while (pHVar1->m_numLongTermRefPicSPS != uVar2);
  }
  return '\0';
}

Assistant:

RK_U8 find_matching_ltrp(H265eSlice* slice, RK_U32 *ltrpsIndex, RK_S32 ltrpPOC, RK_U32 usedFlag)
{
    RK_U32 lsb = ltrpPOC % (1 << slice->m_sps->m_bitsForPOC);
    RK_U32 k;
    for (k = 0; k < slice->m_sps->m_numLongTermRefPicSPS; k++) {
        if ((lsb == slice->m_sps->m_ltRefPicPocLsbSps[k]) && (usedFlag == slice->m_sps->m_usedByCurrPicLtSPSFlag[k])) {
            *ltrpsIndex = k;
            return 1;
        }
    }

    return 0;
}